

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Logger.cpp
# Opt level: O2

double __thiscall Liby::Logger::log(Logger *this,double __x)

{
  char in_AL;
  int iVar1;
  int iVar2;
  long lVar3;
  size_t __n;
  char *pcVar4;
  int in_ESI;
  char *in_R9;
  double extraout_XMM0_Qa;
  va_list args;
  Timestamp local_10f8;
  undefined1 local_10e8 [48];
  double local_10b8;
  char buffer [4096];
  
  if (in_AL != '\0') {
    local_10b8 = __x;
  }
  if ((int)this->level_ <= in_ESI) {
    pcVar4 = getLevelString::levelString_[in_ESI];
    Timestamp::now();
    Timestamp::toString_abi_cxx11_((string *)args,&local_10f8);
    iVar1 = snprintf(buffer,0x1000,"[%s] [%s]: %s: %d %s ",pcVar4,args[0]._0_8_);
    std::__cxx11::string::~string((string *)args);
    args[0].reg_save_area = local_10e8;
    args[0].overflow_arg_area = &stack0x00000008;
    args[0].gp_offset = 0x30;
    args[0].fp_offset = 0x30;
    iVar2 = vsnprintf(buffer + iVar1,(long)(0x1000 - iVar1),in_R9,args);
    lVar3 = (long)(iVar2 + iVar1) << 0x20;
    for (pcVar4 = buffer + (long)(iVar2 + iVar1) + 2; (pcVar4[-2] == '\n' || (pcVar4[-2] == '\0'));
        pcVar4 = pcVar4 + -1) {
      lVar3 = lVar3 + -0x100000000;
    }
    buffer[(lVar3 >> 0x20) + 1] = '\n';
    *pcVar4 = '\0';
    __n = strlen(buffer);
    write(2,buffer,__n);
    __x = extraout_XMM0_Qa;
  }
  return __x;
}

Assistant:

void Logger::log(LogLevel level, const char *file, const int line,
                 const char *func, const char *fmt...) {
    if (level < level_)
        return;
    int offset = 0;
    const int buffersize = 4096;
    char buffer[buffersize];
    char *buf = buffer;

    offset += snprintf(buf + offset, buffersize - offset,
                       "[%s] [%s]: %s: %d %s ", Logger::getLevelString(level),
                       Timestamp::now().toString().c_str(), file, line, func);

    va_list args;
    va_start(args, fmt);
    offset += vsnprintf(buf + offset, buffersize - offset, fmt, args);
    va_end(args);

    while (buf[offset] == '\n' || buf[offset] == '\0')
        offset--;
    buf[++offset] = '\n';
    buf[++offset] = '\0';

    int ret = ::write(STDERR_FILENO, buf, ::strlen(buf));
    // avoid the "variable set but not use" warning
    ClearUnuseVariableWarning(ret);

    //    queue_.push_notify(std::string(buf));
}